

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# various_input.cpp
# Opt level: O0

void use_peek(void)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  ulong uVar4;
  ostream *poVar5;
  char local_9;
  char ch;
  
  do {
    plVar3 = (long *)std::istream::get((char *)&std::cin);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar1) {
LAB_0013c59b:
      uVar4 = std::ios::eof();
      if ((uVar4 & 1) != 0) {
        std::operator<<((ostream *)&std::cout,"EOF reached.\n");
        exit(0);
      }
      std::istream::get((char *)&std::cin);
      poVar5 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,local_9);
      std::operator<<(poVar5," is the next char.\n");
      while (iVar2 = std::istream::peek(), iVar2 != 0x23) {
        std::istream::get((char *)&std::cin);
        std::operator<<((ostream *)&std::cout,local_9);
      }
      uVar4 = std::ios::eof();
      if ((uVar4 & 1) == 0) {
        std::istream::get((char *)&std::cin);
        poVar5 = (ostream *)
                 std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,local_9);
        std::operator<<(poVar5," is the next char.\n");
      }
      else {
        std::operator<<((ostream *)&std::cout,"EOF reached.\n");
      }
      return;
    }
    if (local_9 == '#') {
      std::istream::putback('@');
      goto LAB_0013c59b;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,local_9);
    std::operator<<(poVar5,"-");
  } while( true );
}

Assistant:

void use_peek() {
    using namespace std;

    char ch;
    while(cin.get(ch)) {    //  stop when EOF
        if (ch != '#') {
            cout << ch << "-";
        } else {
            //  make '#' back into stream
            cin.putback(ch);
            break;
        }
    }

    if (!cin.eof()) {
        cin.get(ch);    // always '#'
        cout << endl << ch << " is the next char.\n";
    } else {
        cout << "EOF reached.\n";
        exit(0);
    }

    //  read until meet '#'
    while(cin.peek() != '#') {
        cin.get(ch);
        cout << ch;
    }
    if (!cin.eof()) {
        cin.get(ch);    //  always '#'
        cout << endl << ch << " is the next char.\n";
    } else {
        cout << "EOF reached.\n";
    }
}